

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::overlap_iterator::
setToBegin(overlap_iterator *this)

{
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *this_00;
  uint32_t uVar1;
  
  this_00 = (this->super_iterator).super_const_iterator.map;
  if (this_00->height != 0) {
    uVar1 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>
            ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>
                                *)this_00,0,this_00->rootSize,&this->searchKey);
    const_iterator::setRoot((const_iterator *)this,uVar1);
    treeFind(this);
    return;
  }
  uVar1 = IntervalMapDetails::
          NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>_>
          ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>_>
                              *)this_00,0,this_00->rootSize,&this->searchKey);
  const_iterator::setRoot((const_iterator *)this,uVar1);
  return;
}

Assistant:

void setToBegin() {
        if (this->isFlat()) {
            this->setRoot(this->map->rootLeaf.findFirstOverlap(0, this->map->rootSize, searchKey));
        }
        else {
            this->setRoot(
                this->map->rootBranch.findFirstOverlap(0, this->map->rootSize, searchKey));
            treeFind();
        }
    }